

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_final(sha256_t *p,uchar *digest)

{
  undefined1 *puVar1;
  undefined1 *in_RSI;
  sha256_t *in_RDI;
  uint i;
  uint32_t curBufferPos;
  uint64_t lenInBits;
  uint local_20;
  uint local_1c;
  long local_18;
  undefined1 *local_10;
  
  local_18 = in_RDI->count << 3;
  local_1c = (uint)in_RDI->count & 0x3f;
  in_RDI->buffer[local_1c] = 0x80;
  while (local_1c = local_1c + 1, local_1c != 0x38) {
    local_1c = local_1c & 0x3f;
    if (local_1c == 0) {
      sha256_write_byte_block(p);
    }
    in_RDI->buffer[local_1c] = '\0';
  }
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    in_RDI->buffer[local_1c] = (uchar)((ulong)local_18 >> 0x38);
    local_18 = local_18 << 8;
    local_1c = local_1c + 1;
  }
  sha256_write_byte_block(p);
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    *local_10 = (char)(in_RDI->state[local_20] >> 0x18);
    local_10[1] = (char)(in_RDI->state[local_20] >> 0x10);
    puVar1 = local_10 + 3;
    local_10[2] = (char)(in_RDI->state[local_20] >> 8);
    local_10 = local_10 + 4;
    *puVar1 = (char)in_RDI->state[local_20];
  }
  sha256_init(in_RDI);
  return;
}

Assistant:

void
sha256_final(sha256_t *p, unsigned char *digest)
{
  uint64_t lenInBits = (p->count << 3);
  uint32_t curBufferPos = (uint32_t)p->count & 0x3F;
  unsigned i;
  p->buffer[curBufferPos++] = 0x80;
  while (curBufferPos != (64 - 8))
  {
    curBufferPos &= 0x3F;
    if (curBufferPos == 0)
      sha256_write_byte_block(p);
    p->buffer[curBufferPos++] = 0;
  }
  for (i = 0; i < 8; i++)
  {
    p->buffer[curBufferPos++] = (unsigned char)(lenInBits >> 56);
    lenInBits <<= 8;
  }
  sha256_write_byte_block(p);

  for (i = 0; i < 8; i++)
  {
    *digest++ = (unsigned char)(p->state[i] >> 24);
    *digest++ = (unsigned char)(p->state[i] >> 16);
    *digest++ = (unsigned char)(p->state[i] >> 8);
    *digest++ = (unsigned char)(p->state[i]);
  }
  sha256_init(p);
}